

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::AggressiveDCEPass::AddDebugInstructionsToWorkList
          (AggressiveDCEPass *this,Instruction *inst)

{
  pointer pIVar1;
  bool bVar2;
  Instruction *line_inst;
  pointer this_00;
  
  pIVar1 = (inst->dbg_line_insts_).
           super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (inst->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pIVar1; this_00 = this_00 + 1
      ) {
    bVar2 = Instruction::IsDebugLineInst(this_00);
    if (bVar2) {
      AddOperandsToWorkList(this,this_00);
    }
    AddDebugScopeToWorkList(this,this_00);
  }
  AddDebugScopeToWorkList(this,inst);
  return;
}

Assistant:

void AggressiveDCEPass::AddDebugInstructionsToWorkList(
    const Instruction* inst) {
  for (auto& line_inst : inst->dbg_line_insts()) {
    if (line_inst.IsDebugLineInst()) {
      AddOperandsToWorkList(&line_inst);
    }
    AddDebugScopeToWorkList(&line_inst);
  }
  AddDebugScopeToWorkList(inst);
}